

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_sunnonlinsol_newton.c
# Opt level: O3

int main(int argc,char **argv)

{
  undefined8 *puVar1;
  undefined4 *puVar2;
  uint uVar3;
  undefined8 *mem;
  N_Vector w;
  N_Vector y0;
  N_Vector y;
  N_Vector w_00;
  SUNMatrix A;
  SUNLinearSolver S;
  SUNNonlinearSolver NLS;
  char *pcVar4;
  long niters;
  long local_38;
  
  mem = (undefined8 *)malloc(0x18);
  w = (N_Vector)N_VNew_Serial(3);
  if (w == (N_Vector)0x0) {
    main_cold_7();
  }
  else {
    y0 = N_VClone(w);
    if (y0 == (N_Vector)0x0) {
      main_cold_6();
    }
    else {
      y = N_VClone(w);
      if (y == (N_Vector)0x0) {
        main_cold_5();
      }
      else {
        w_00 = N_VClone(w);
        if (w_00 == (N_Vector)0x0) {
          main_cold_4();
        }
        else {
          puVar1 = *(undefined8 **)((long)y0->content + 0x10);
          *puVar1 = 0x3fe0000000000000;
          puVar1[1] = 0x3fe0000000000000;
          puVar1[2] = 0x3fe0000000000000;
          puVar2 = *(undefined4 **)((long)w_00->content + 0x10);
          *puVar2 = 0;
          puVar2[1] = 0x3ff00000;
          puVar2[2] = 0;
          puVar2[3] = 0x3ff00000;
          *(undefined8 *)(puVar2 + 4) = 0x3ff0000000000000;
          A = (SUNMatrix)SUNDenseMatrix(3,3);
          if (A == (SUNMatrix)0x0) {
            main_cold_3();
          }
          else {
            S = (SUNLinearSolver)SUNLinSol_Dense(y,A);
            if (S == (SUNLinearSolver)0x0) {
              main_cold_2();
            }
            else {
              uVar3 = SUNLinSolInitialize(S);
              if (uVar3 == 0) {
                *mem = w;
                mem[1] = A;
                mem[2] = S;
                NLS = (SUNNonlinearSolver)SUNNonlinSol_Newton(y);
                if (NLS == (SUNNonlinearSolver)0x0) {
                  main_cold_1();
                  return 1;
                }
                uVar3 = SUNNonlinSolSetSysFn(NLS,Res);
                if (uVar3 == 0) {
                  uVar3 = SUNNonlinSolSetLSetupFn(NLS,LSetup);
                  if (uVar3 == 0) {
                    uVar3 = SUNNonlinSolSetLSolveFn(NLS,LSolve);
                    if (uVar3 == 0) {
                      uVar3 = SUNNonlinSolSetConvTestFn(NLS,ConvTest);
                      if (uVar3 == 0) {
                        uVar3 = SUNNonlinSolSetMaxIters(NLS,10);
                        if (uVar3 == 0) {
                          uVar3 = SUNNonlinSolSolve(NLS,y0,y,w_00,0.01,1,mem);
                          if (uVar3 == 0) {
                            puts("Solution:");
                            printf("y1 = %g\n",(int)**(undefined8 **)((long)y->content + 0x10));
                            printf("y2 = %g\n",
                                   (int)*(undefined8 *)(*(long *)((long)y->content + 0x10) + 8));
                            printf("y3 = %g\n",
                                   (int)*(undefined8 *)(*(long *)((long)y->content + 0x10) + 0x10));
                            puts("Solution Error:");
                            printf("e1 = %g\n",
                                   SUB84(**(double **)((long)y->content + 0x10) +
                                         -0.7851969330623553,0));
                            printf("e2 = %g\n",
                                   SUB84(*(double *)(*(long *)((long)y->content + 0x10) + 8) +
                                         -0.4966113929446564,0));
                            printf("e3 = %g\n",
                                   SUB84(*(double *)(*(long *)((long)y->content + 0x10) + 0x10) +
                                         -0.36992283074587234,0));
                            uVar3 = SUNNonlinSolGetNumIters(NLS,&local_38);
                            if (uVar3 == 0) {
                              printf("Number of nonlinear iterations: %ld\n",local_38);
                              N_VDestroy(w);
                              N_VDestroy(y0);
                              N_VDestroy(y);
                              N_VDestroy(w_00);
                              SUNMatDestroy(A);
                              SUNLinSolFree(S);
                              SUNNonlinSolFree(NLS);
                              free(mem);
                              puts("SUCCESS");
                              return 0;
                            }
                            pcVar4 = "SUNNonlinSolGetNumIters";
                          }
                          else {
                            pcVar4 = "SUNNonlinSolSolve";
                          }
                        }
                        else {
                          pcVar4 = "SUNNonlinSolSetMaxIters";
                        }
                      }
                      else {
                        pcVar4 = "SUNNonlinSolSetConvTestFn";
                      }
                    }
                    else {
                      pcVar4 = "SUNNonlinSolSetSolveFn";
                    }
                  }
                  else {
                    pcVar4 = "SUNNonlinSolSetSetupFn";
                  }
                }
                else {
                  pcVar4 = "SUNNonlinSolSetSysFn";
                }
              }
              else {
                pcVar4 = "SUNLinSolInitialize";
              }
              fprintf(_stderr,"\nERROR: %s() failed -- returned %d\n\n",pcVar4,(ulong)uVar3);
            }
          }
        }
      }
    }
  }
  return 1;
}

Assistant:

int main(int argc, char *argv[]) 
{
  int                retval = 0;
  N_Vector           x, y0, y, w;
  SUNMatrix          A;
  SUNLinearSolver    LS;
  SUNNonlinearSolver NLS;
  IntegratorMem      Imem;
  long int           niters;
  
  /* create integrator memory */
  Imem = (IntegratorMem) malloc(sizeof(struct IntegratorMemRec));

  /* create vector */
  x  = N_VNew_Serial(NEQ);
  if (check_retval((void *)x, "N_VNew_Serial", 0)) return(1);

  y0 = N_VClone(x);
  if (check_retval((void *)y0, "N_VNew_Serial", 0)) return(1);

  y  = N_VClone(x);
  if (check_retval((void *)y, "N_VNew_Serial", 0)) return(1);

  w  = N_VClone(x);
  if (check_retval((void *)w, "N_VNew_Serial", 0)) return(1);

  /* set initial guess */
  NV_Ith_S(y0,0) = HALF;
  NV_Ith_S(y0,1) = HALF;
  NV_Ith_S(y0,2) = HALF;

  /* set weights */
  NV_Ith_S(w,0) = ONE;
  NV_Ith_S(w,1) = ONE;
  NV_Ith_S(w,2) = ONE;
  
  /* create dense matrix */
  A = SUNDenseMatrix(NEQ, NEQ);
  if (check_retval((void *)A, "SUNDenseMatrix", 0)) return(1);

  /* create dense linear solver */
  LS  = SUNLinSol_Dense(y, A);
  if (check_retval((void *)LS, "SUNLinSol_Dense", 0)) return(1);

  /* initialize the linear solver */
  retval = SUNLinSolInitialize(LS);
  if (check_retval(&retval, "SUNLinSolInitialize", 1)) return(1);

  /* set integrator memory */
  Imem->x  = x;
  Imem->A  = A;
  Imem->LS = LS;

  /* create nonlinear solver */
  NLS = SUNNonlinSol_Newton(y);
  if (check_retval((void *)NLS, "SUNNonlinSol_Newton", 0)) return(1);

  /* set the nonlinear residual function */
  retval = SUNNonlinSolSetSysFn(NLS, Res);
  if (check_retval(&retval, "SUNNonlinSolSetSysFn", 1)) return(1);

  /* set the wrapper functions to linear solver setup and solve functions */
  retval = SUNNonlinSolSetLSetupFn(NLS, LSetup);
  if (check_retval(&retval, "SUNNonlinSolSetSetupFn", 1)) return(1);

  retval = SUNNonlinSolSetLSolveFn(NLS, LSolve);
  if (check_retval(&retval, "SUNNonlinSolSetSolveFn", 1)) return(1);

  retval = SUNNonlinSolSetConvTestFn(NLS, ConvTest);
  if (check_retval(&retval, "SUNNonlinSolSetConvTestFn", 1)) return(1);

  /* set the maximum number of nonlinear iterations */
  retval = SUNNonlinSolSetMaxIters(NLS, MAXIT);
  if (check_retval(&retval, "SUNNonlinSolSetMaxIters", 1)) return(1);

  /* solve the nonlinear system */
  retval = SUNNonlinSolSolve(NLS, y0, y, w, TOL, SUNTRUE, Imem);
  if (check_retval(&retval, "SUNNonlinSolSolve", 1)) return(1);

  /* print the solution */
  printf("Solution:\n");
  printf("y1 = %g\n",NV_Ith_S(y,0));
  printf("y2 = %g\n",NV_Ith_S(y,1));
  printf("y3 = %g\n",NV_Ith_S(y,2));

  /* print the solution error */
  printf("Solution Error:\n");
  printf("e1 = %g\n",NV_Ith_S(y,0) - Y1);
  printf("e2 = %g\n",NV_Ith_S(y,1) - Y2);
  printf("e3 = %g\n",NV_Ith_S(y,2) - Y3);

  /* get the number of linear iterations */
  retval = SUNNonlinSolGetNumIters(NLS, &niters);
  if (check_retval(&retval, "SUNNonlinSolGetNumIters", 1)) return(1);

  printf("Number of nonlinear iterations: %ld\n",niters);

  /* Free vector, matrix, linear solver, and nonlinear solver */
  N_VDestroy(x);
  N_VDestroy(y0);
  N_VDestroy(y);
  N_VDestroy(w);
  SUNMatDestroy(A);
  SUNLinSolFree(LS);
  SUNNonlinSolFree(NLS);
  free(Imem);

  /* Print result */
  if (retval) {
    printf("FAIL\n");
  } else {
    printf("SUCCESS\n");
  }

  return(retval);
}